

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleTextWidget::textAtOffset
          (QString *__return_storage_ptr__,QAccessibleTextWidget *this,int offset,
          TextBoundaryType boundaryType,int *startOffset,int *endOffset)

{
  ulong uVar1;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))((QTextCursor *)&local_40);
  QTextCursor::setPosition((int)(QTextCursor *)&local_40,offset);
  uVar1 = QAccessible::qAccessibleTextBoundaryHelper((QTextCursor *)&local_40,boundaryType);
  *startOffset = (int)uVar1;
  *endOffset = (int)(uVar1 >> 0x20);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0xf8))
            (__return_storage_ptr__,this,uVar1 & 0xffffffff);
  QTextCursor::~QTextCursor((QTextCursor *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::textAtOffset(int offset, QAccessible::TextBoundaryType boundaryType,
                                            int *startOffset, int *endOffset) const
{
    Q_ASSERT(startOffset);
    Q_ASSERT(endOffset);

    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    std::pair<int, int> boundaries = QAccessible::qAccessibleTextBoundaryHelper(cursor, boundaryType);

    *startOffset = boundaries.first;
    *endOffset = boundaries.second;

    return text(boundaries.first, boundaries.second);
}